

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KalmanFilter.cpp
# Opt level: O3

bool __thiscall
iDynTree::DiscreteKalmanFilterHelper::constructKalmanFilter
          (DiscreteKalmanFilterHelper *this,MatrixDynSize *A,MatrixDynSize *B,MatrixDynSize *C,
          MatrixDynSize *D)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  char *pcVar5;
  
  lVar1 = iDynTree::MatrixDynSize::rows();
  lVar2 = iDynTree::MatrixDynSize::cols();
  if (lVar1 == lVar2) {
    uVar3 = iDynTree::MatrixDynSize::rows();
    this->m_dim_X = uVar3;
    iDynTree::MatrixDynSize::resize((ulong)&this->m_A,uVar3);
    iDynTree::MatrixDynSize::operator=(&this->m_A,A);
    iDynTree::MatrixDynSize::resize((ulong)&this->m_P,this->m_dim_X);
    iDynTree::MatrixDynSize::zero();
    iDynTree::MatrixDynSize::resize((ulong)&this->m_Q,this->m_dim_X);
    iDynTree::MatrixDynSize::zero();
    lVar1 = iDynTree::MatrixDynSize::capacity();
    if (lVar1 == 0) {
      this->m_use_control_input = false;
    }
    else {
      lVar1 = iDynTree::MatrixDynSize::rows();
      lVar2 = iDynTree::MatrixDynSize::rows();
      if (lVar1 != lVar2) {
        pcVar5 = "Could not construct KF -  control input matrix B dimension mismatch, exiting.";
        goto LAB_0016533a;
      }
      this->m_use_control_input = true;
      iDynTree::MatrixDynSize::operator=(&this->m_B,B);
    }
    sVar4 = iDynTree::MatrixDynSize::cols();
    this->m_dim_U = sVar4;
    iDynTree::VectorDynSize::resize((ulong)&this->m_u);
    iDynTree::VectorDynSize::zero();
    lVar1 = iDynTree::MatrixDynSize::capacity();
    if (lVar1 != 0) {
      lVar1 = iDynTree::MatrixDynSize::cols();
      lVar2 = iDynTree::MatrixDynSize::rows();
      if (lVar1 == lVar2) {
        sVar4 = iDynTree::MatrixDynSize::rows();
        this->m_dim_Y = sVar4;
        iDynTree::MatrixDynSize::operator=(&this->m_C,C);
        iDynTree::VectorDynSize::resize((ulong)&this->m_y);
        iDynTree::VectorDynSize::zero();
        iDynTree::MatrixDynSize::resize((ulong)&this->m_R,this->m_dim_Y);
        iDynTree::MatrixDynSize::zero();
        lVar1 = iDynTree::MatrixDynSize::capacity();
        if (lVar1 == 0) {
          this->m_use_feed_through = false;
LAB_00165357:
          this->m_filter_constructed = true;
          return true;
        }
        lVar1 = iDynTree::MatrixDynSize::rows();
        lVar2 = iDynTree::MatrixDynSize::rows();
        if (lVar1 == lVar2) {
          lVar1 = iDynTree::MatrixDynSize::cols();
          lVar2 = iDynTree::MatrixDynSize::rows();
          if (lVar1 == lVar2) {
            this->m_use_feed_through = true;
            iDynTree::MatrixDynSize::operator=(&this->m_D,D);
            goto LAB_00165357;
          }
        }
        pcVar5 = 
        "Could not construct KF -  control feedthrough matrix D dimension mismatch, exiting.";
        goto LAB_0016533a;
      }
    }
    pcVar5 = "Could not construct KF -  output matrix C dimension mismatch, exiting.";
  }
  else {
    pcVar5 = "Could not construct KF - ill-formed state transition matrix A, exiting.";
  }
LAB_0016533a:
  iDynTree::reportError("DiscreteKalmanFilterHelper","constructKalmanFilter",pcVar5);
  return false;
}

Assistant:

bool iDynTree::DiscreteKalmanFilterHelper::constructKalmanFilter(const iDynTree::MatrixDynSize& A, const iDynTree::MatrixDynSize& B, const iDynTree::MatrixDynSize& C, const iDynTree::MatrixDynSize& D)
{
    if (A.rows() != A.cols())
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "constructKalmanFilter", "Could not construct KF - ill-formed state transition matrix A, exiting.");
        return false;
    }
    m_dim_X = A.rows();
    m_A.resize(m_dim_X, m_dim_X);
    m_A = A;
    m_P.resize(m_dim_X, m_dim_X);
    m_P.zero();
    m_Q.resize(m_dim_X, m_dim_X);
    m_Q.zero();

    if (B.capacity() ==  0)
    {
        m_use_control_input = false;
    }
    else if (B.rows() != A.rows())
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "constructKalmanFilter", "Could not construct KF -  control input matrix B dimension mismatch, exiting.");
        return false;
    }
    else
    {
        m_use_control_input = true;
        m_B = B;
    }

    m_dim_U = m_B.cols();
    m_u.resize(m_dim_U);
    m_u.zero();

    if (C.capacity() == 0 || (C.cols() != A.rows()))
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "constructKalmanFilter", "Could not construct KF -  output matrix C dimension mismatch, exiting.");
        return false;
    }
    m_dim_Y = C.rows();
    m_C = C;
    m_y.resize(m_dim_Y);
    m_y.zero();
    m_R.resize(m_dim_Y, m_dim_Y);
    m_R.zero();

    if (D.capacity() ==  0)
    {
        m_use_feed_through = false;
    }
    else if ((D.rows() != C.rows()) || (D.cols() != B.rows()))
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "constructKalmanFilter", "Could not construct KF -  control feedthrough matrix D dimension mismatch, exiting.");
        return false;
    }
    else
    {
        m_use_feed_through = true;
        m_D = D;
    }

    m_filter_constructed = true;
    return true;
}